

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::Printf<std::__cxx11::string,float&,float&,float&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               float *args_1,float *args_2,float *args_3)

{
  string s;
  _Alloc_hider in_stack_ffffffffffffffd8;
  
  StringPrintf<std::__cxx11::string,float&,float&,float&>
            ((string *)&stack0xffffffffffffffd8,(pbrt *)fmt,(char *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,args_2,
             args_3,(float *)in_stack_ffffffffffffffd8._M_p);
  fputs(in_stack_ffffffffffffffd8._M_p,_stdout);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}